

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_HeartGenerator.h
# Opt level: O2

Expression * __thiscall
soul::HEARTGenerator::getAsReference(HEARTGenerator *this,Expression *e,bool isConstRef)

{
  VariableRef *pVVar1;
  Variable *pVVar2;
  Expression *pEVar3;
  StructMemberRef *member;
  StructMemberRef *pSVar4;
  ArrayElement *pAVar5;
  ArrayElementRef *subscript;
  ArrayElementRef *pAVar6;
  Expression *e_00;
  pool_ptr<soul::AST::VariableRef> v;
  pool_ptr<soul::AST::StructMemberRef> local_60;
  CompileMessage local_58;
  
  cast<soul::AST::VariableRef,soul::AST::Expression>((soul *)&local_60,e);
  if (local_60.object != (StructMemberRef *)0x0) {
    pVVar1 = pool_ptr<soul::AST::VariableRef>::operator->
                       ((pool_ptr<soul::AST::VariableRef> *)&local_60);
    if ((((pVVar1->variable).object)->generatedVariable).object != (Variable *)0x0) {
      pVVar1 = pool_ptr<soul::AST::VariableRef>::operator->
                         ((pool_ptr<soul::AST::VariableRef> *)&local_60);
      pVVar2 = pool_ptr<soul::heart::Variable>::operator*
                         (&((pVVar1->variable).object)->generatedVariable);
      return &pVVar2->super_Expression;
    }
    if (isConstRef) {
      pVVar1 = pool_ptr<soul::AST::VariableRef>::operator*
                         ((pool_ptr<soul::AST::VariableRef> *)&local_60);
      pEVar3 = evaluateAsConstantExpression(this,&pVVar1->super_Expression);
      return pEVar3;
    }
  }
  cast<soul::AST::StructMemberRef,soul::AST::Expression>((soul *)&local_60,e);
  if (local_60.object == (StructMemberRef *)0x0) {
    cast<soul::AST::ArrayElementRef,soul::AST::Expression>((soul *)&local_60,e);
    if (local_60.object == (StructMemberRef *)0x0) {
      if (!isConstRef) {
        Errors::expressionNotAssignable<>();
        AST::Context::throwError(&(e->super_Statement).super_ASTObject.context,&local_58,false);
      }
      pAVar5 = (ArrayElement *)getExpressionAsMutableLocalCopy(this,e);
    }
    else {
      subscript = pool_ptr<soul::AST::ArrayElementRef>::operator*
                            ((pool_ptr<soul::AST::ArrayElementRef> *)&local_60);
      pAVar6 = pool_ptr<soul::AST::ArrayElementRef>::operator->
                         ((pool_ptr<soul::AST::ArrayElementRef> *)&local_60);
      e_00 = pool_ptr<soul::AST::Expression>::operator*(&pAVar6->object);
      pEVar3 = getAsReference(this,e_00,isConstRef);
      pAVar5 = createArraySubElement(this,subscript,pEVar3);
    }
  }
  else {
    member = pool_ptr<soul::AST::StructMemberRef>::operator*(&local_60);
    pSVar4 = pool_ptr<soul::AST::StructMemberRef>::operator->(&local_60);
    pEVar3 = getAsReference(this,(pSVar4->object).object,isConstRef);
    pAVar5 = (ArrayElement *)createStructSubElement(this,member,pEVar3);
  }
  return &pAVar5->super_Expression;
}

Assistant:

heart::Expression& getAsReference (AST::Expression& e, bool isConstRef)
    {
        if (auto v = cast<AST::VariableRef> (e))
        {
            if (v->variable->generatedVariable != nullptr)
                return v->variable->getGeneratedVariable();

            if (isConstRef)
                return evaluateAsConstantExpression (*v);
        }

        if (auto member = cast<AST::StructMemberRef> (e))
            return createStructSubElement (*member, getAsReference (member->object, isConstRef));

        if (auto subscript = cast<AST::ArrayElementRef> (e))
            return createArraySubElement (*subscript, getAsReference (*subscript->object, isConstRef));

        if (isConstRef)
            return getExpressionAsMutableLocalCopy (e);

        e.context.throwError (Errors::expressionNotAssignable());
    }